

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode serial_transfers(GlobalConfig *global,CURLSH *share)

{
  bool bVar1;
  _Bool _Var2;
  timediff_t tVar3;
  curltime cVar4;
  curltime cVar5;
  curltime newer;
  timediff_t milli;
  curltime start;
  long lStack_40;
  _Bool bailout;
  long delay_ms;
  _Bool retry;
  _Bool skipped;
  per_transfer *ppStack_30;
  _Bool added;
  per_transfer *per;
  CURLcode result;
  CURLcode returncode;
  CURLSH *share_local;
  GlobalConfig *global_local;
  
  per._4_4_ = CURLE_OK;
  per._0_4_ = 0;
  delay_ms._7_1_ = 0;
  delay_ms._6_1_ = 0;
  _result = share;
  share_local = global;
  per._0_4_ = create_transfer(global,share,(_Bool *)((long)&delay_ms + 7),
                              (_Bool *)((long)&delay_ms + 6));
  global_local._4_4_ = (CURLcode)per;
  if ((CURLcode)per == CURLE_OK) {
    if ((delay_ms._7_1_ & 1) == 0) {
      errorf((GlobalConfig *)share_local,"no transfer performed");
      global_local._4_4_ = CURLE_READ_ERROR;
    }
    else {
      ppStack_30 = transfers;
      while (ppStack_30 != (per_transfer *)0x0) {
        bVar1 = false;
        cVar4 = curlx_now();
        if (((byte)ppStack_30->field_0x1d8 >> 5 & 1) == 0) {
          per._0_4_ = pre_transfer((GlobalConfig *)share_local,ppStack_30);
          if (((CURLcode)per != CURLE_OK) ||
             ((*(long *)((long)share_local + 0x10) != 0 &&
              (per._0_4_ = easysrc_perform(), (CURLcode)per != CURLE_OK)))) break;
          per._0_4_ = 0;
          per._0_4_ = curl_easy_perform(ppStack_30->curl);
        }
        per._4_4_ = post_per_transfer((GlobalConfig *)share_local,ppStack_30,(CURLcode)per,
                                      (_Bool *)((long)&delay_ms + 5),&stack0xffffffffffffffc0);
        if ((delay_ms._5_1_ & 1) == 0) {
          _Var2 = is_fatal_error(per._4_4_);
          if ((_Var2) ||
             ((per._4_4_ != CURLE_OK && ((*(ushort *)((long)share_local + 99) >> 2 & 1) != 0)))) {
            bVar1 = true;
          }
          else {
            do {
              per._0_4_ = create_transfer((GlobalConfig *)share_local,_result,
                                          (_Bool *)((long)&delay_ms + 7),
                                          (_Bool *)((long)&delay_ms + 6));
              if ((CURLcode)per != CURLE_OK) {
                bVar1 = true;
                per._4_4_ = (CURLcode)per;
                break;
              }
            } while ((delay_ms._6_1_ & 1) != 0);
          }
          ppStack_30 = del_per_transfer(ppStack_30);
          if (bVar1) break;
          if ((ppStack_30 != (per_transfer *)0x0) && (*(long *)((long)share_local + 0x50) != 0)) {
            cVar5 = curlx_now();
            newer._12_4_ = 0;
            newer.tv_sec = SUB128(cVar5._0_12_,0);
            newer.tv_usec = SUB124(cVar5._0_12_,8);
            cVar5._12_4_ = 0;
            cVar5.tv_sec = SUB128(cVar4._0_12_,0);
            cVar5.tv_usec = SUB124(cVar4._0_12_,8);
            tVar3 = curlx_timediff(newer,cVar5);
            if (tVar3 < *(long *)((long)share_local + 0x50)) {
              notef((GlobalConfig *)share_local,"Transfer took %ld ms, waits %ldms as set by --rate"
                    ,tVar3,*(long *)((long)share_local + 0x50) - tVar3);
              tool_go_sleep(*(long *)((long)share_local + 0x50) - tVar3);
            }
          }
        }
        else {
          tool_go_sleep(lStack_40);
        }
      }
      if (per._4_4_ != CURLE_OK) {
        per._0_4_ = per._4_4_;
      }
      if ((CURLcode)per != CURLE_OK) {
        single_transfer_cleanup(*(OperationConfig **)((long)share_local + 0x40));
      }
      global_local._4_4_ = (CURLcode)per;
    }
  }
  return global_local._4_4_;
}

Assistant:

static CURLcode serial_transfers(struct GlobalConfig *global,
                                 CURLSH *share)
{
  CURLcode returncode = CURLE_OK;
  CURLcode result = CURLE_OK;
  struct per_transfer *per;
  bool added = FALSE;
  bool skipped = FALSE;

  result = create_transfer(global, share, &added, &skipped);
  if(result)
    return result;
  if(!added) {
    errorf(global, "no transfer performed");
    return CURLE_READ_ERROR;
  }
  for(per = transfers; per;) {
    bool retry;
    long delay_ms;
    bool bailout = FALSE;
    struct curltime start;

    start = curlx_now();
    if(!per->skip) {
      result = pre_transfer(global, per);
      if(result)
        break;

      if(global->libcurl) {
        result = easysrc_perform();
        if(result)
          break;
      }

#ifdef DEBUGBUILD
      if(getenv("CURL_FORBID_REUSE"))
        (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);

      if(global->test_duphandle) {
        CURL *dup = curl_easy_duphandle(per->curl);
        curl_easy_cleanup(per->curl);
        per->curl = dup;
        if(!dup) {
          result = CURLE_OUT_OF_MEMORY;
          break;
        }
        /* a duplicate needs the share re-added */
        (void)curl_easy_setopt(per->curl, CURLOPT_SHARE, share);
      }
      if(global->test_event_based)
        result = curl_easy_perform_ev(per->curl);
      else
#endif
        result = curl_easy_perform(per->curl);
    }

    returncode = post_per_transfer(global, per, result, &retry, &delay_ms);
    if(retry) {
      tool_go_sleep(delay_ms);
      continue;
    }

    /* Bail out upon critical errors or --fail-early */
    if(is_fatal_error(returncode) || (returncode && global->fail_early))
      bailout = TRUE;
    else {
      do {
        /* setup the next one just before we delete this */
        result = create_transfer(global, share, &added, &skipped);
        if(result) {
          returncode = result;
          bailout = TRUE;
          break;
        }
      } while(skipped);
    }

    per = del_per_transfer(per);

    if(bailout)
      break;

    if(per && global->ms_per_transfer) {
      /* how long time did the most recent transfer take in number of
         milliseconds */
      timediff_t milli = curlx_timediff(curlx_now(), start);
      if(milli < global->ms_per_transfer) {
        notef(global, "Transfer took %" CURL_FORMAT_CURL_OFF_T " ms, "
                      "waits %ldms as set by --rate",
              milli, (long)(global->ms_per_transfer - milli));
        /* The transfer took less time than wanted. Wait a little. */
        tool_go_sleep((long)(global->ms_per_transfer - milli));
      }
    }
  }
  if(returncode)
    /* returncode errors have priority */
    result = returncode;

  if(result)
    single_transfer_cleanup(global->current);

  return result;
}